

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool cmCTestRunTest::StartAgain
               (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner,
               size_t completed)

{
  int *__args;
  bool bVar1;
  int __errnum;
  pointer this;
  char *__rhs;
  allocator<char> local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_58 [8];
  cmWorkingDirectory workdir;
  cmCTestRunTest *testRun;
  size_t completed_local;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner_local;
  
  this = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::get(runner);
  if ((this->RunAgain & 1U) == 0) {
    runner_local._7_1_ = false;
  }
  else {
    this->RunAgain = false;
    __args = &workdir.ResultCode;
    std::make_unique<cmProcess,std::unique_ptr<cmCTestRunTest,std::default_delete<cmCTestRunTest>>>
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)__args);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
              (&this->TestProcess,(unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)__args);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)__args);
    cmWorkingDirectory::cmWorkingDirectory
              ((cmWorkingDirectory *)local_58,&this->TestProperties->Directory);
    bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_58);
    if (bVar1) {
      std::operator+(&local_c8,"Failed to change working directory to ",
                     &this->TestProperties->Directory);
      std::operator+(&local_a8,&local_c8," : ");
      __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_58);
      __rhs = strerror(__errnum);
      std::operator+(&local_88,&local_a8,__rhs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Failed to change working directory",&local_e9);
      StartFailure(this,&local_88,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      StartTest(this,completed,this->TotalNumberOfTests);
    }
    runner_local._7_1_ = true;
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_58);
  }
  return runner_local._7_1_;
}

Assistant:

bool cmCTestRunTest::StartAgain(std::unique_ptr<cmCTestRunTest> runner,
                                size_t completed)
{
  auto* testRun = runner.get();

  if (!testRun->RunAgain) {
    return false;
  }
  testRun->RunAgain = false; // reset
  testRun->TestProcess = cm::make_unique<cmProcess>(std::move(runner));
  // change to tests directory
  cmWorkingDirectory workdir(testRun->TestProperties->Directory);
  if (workdir.Failed()) {
    testRun->StartFailure("Failed to change working directory to " +
                            testRun->TestProperties->Directory + " : " +
                            std::strerror(workdir.GetLastResult()),
                          "Failed to change working directory");
    return true;
  }

  testRun->StartTest(completed, testRun->TotalNumberOfTests);
  return true;
}